

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uamqp_messaging.c
# Opt level: O0

int set_message_content_type_if_needed
              (IOTHUB_MESSAGE_HANDLE messageHandle,PROPERTIES_HANDLE uamqp_message_properties)

{
  int iVar1;
  char *content_type_value;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l;
  char *content_type;
  int result;
  PROPERTIES_HANDLE uamqp_message_properties_local;
  IOTHUB_MESSAGE_HANDLE messageHandle_local;
  
  content_type_value = IoTHubMessage_GetContentTypeSystemProperty(messageHandle);
  if (content_type_value == (char *)0x0) {
    content_type._4_4_ = 0;
  }
  else {
    iVar1 = properties_set_content_type(uamqp_message_properties,content_type_value);
    if (iVar1 == 0) {
      content_type._4_4_ = 0;
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                  ,"set_message_content_type_if_needed",0x80,1,"Failed properties_set_content_type")
        ;
      }
      content_type._4_4_ = 0x81;
    }
  }
  return content_type._4_4_;
}

Assistant:

static int set_message_content_type_if_needed(IOTHUB_MESSAGE_HANDLE messageHandle, PROPERTIES_HANDLE uamqp_message_properties)
{
    int result;
    const char* content_type;

    if ((content_type = IoTHubMessage_GetContentTypeSystemProperty(messageHandle)) != NULL)
    {
        if (properties_set_content_type(uamqp_message_properties, content_type) != 0)
        {
            LogError("Failed properties_set_content_type");
            result = MU_FAILURE;
        }
        else
        {
            result = RESULT_OK;
        }
    }
    else
    {
        result = RESULT_OK;
    }

    return result;
}